

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

void __thiscall QAbstractItemView::focusInEvent(QAbstractItemView *this,QFocusEvent *event)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  QModelIndex local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  QWidget::focusInEvent((QWidget *)this,event);
  lVar3 = *(long *)(*(long *)(this + 8) + 800);
  bVar8 = true;
  if ((lVar3 != 0) && (*(int *)(lVar3 + 4) != 0)) {
    bVar8 = *(long *)(*(long *)(this + 8) + 0x328) == 0;
  }
  currentIndex(&local_48,this);
  if ((local_48.r < 0) || (local_48.c < 0)) {
    if (!bVar8) {
      bVar9 = false;
      goto LAB_0053503d;
    }
LAB_00535138:
    bVar8 = false;
  }
  else {
    bVar9 = local_48.m.ptr != (QAbstractItemModel *)0x0;
    if (bVar8) {
      if (local_48.m.ptr != (QAbstractItemModel *)0x0) goto LAB_00535147;
      goto LAB_00535138;
    }
LAB_0053503d:
    if ((bVar9) || (*(char *)(lVar2 + 0x490) != '\0')) {
      if (!bVar9) goto LAB_00535138;
    }
    else {
      uVar1 = *(undefined1 *)(lVar2 + 0x418);
      *(undefined1 *)(lVar2 + 0x418) = 0;
      local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.r = -0x55555556;
      local_48.c = -0x55555556;
      local_48.i._0_4_ = 0xaaaaaaaa;
      local_48.i._4_4_ = 0xaaaaaaaa;
      (**(code **)(*(long *)this + 0x2a8))(&local_48,this,8,0);
      if (((local_48.r < 0) ||
          (((local_48.c < 0 || (local_48.m.ptr == (QAbstractItemModel *)0x0)) ||
           (uVar7 = (**(code **)(**(long **)(lVar2 + 0x2f8) + 0x138))
                              (*(long **)(lVar2 + 0x2f8),&local_48), (uVar7 & 0x20) == 0)))) ||
         (iVar5 = QFocusEvent::reason(), iVar5 == 0)) {
        *(undefined1 *)(lVar2 + 0x418) = uVar1;
        goto LAB_00535138;
      }
      plVar4 = *(long **)(*(long *)(this + 8) + 0x328);
      (**(code **)(*plVar4 + 0x60))
                (plVar4,&local_48,0,*(undefined4 *)(*(long *)(*(long *)(this + 8) + 800) + 4));
      *(undefined1 *)(lVar2 + 0x418) = uVar1;
    }
    currentIndex(&local_48,this);
    if (local_48.m.ptr == (QAbstractItemModel *)0x0) {
      bVar8 = false;
    }
    else {
      uVar6 = (**(code **)(*(long *)local_48.m.ptr + 0x138))(local_48.m.ptr,&local_48);
      bVar8 = SUB41((uVar6 & 2) >> 1,0);
    }
  }
  QWidget::setAttribute((QWidget *)this,WA_InputMethodEnabled,bVar8);
LAB_00535147:
  QWidget::update(*(QWidget **)(lVar2 + 0x2b0));
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractItemView::focusInEvent(QFocusEvent *event)
{
    Q_D(QAbstractItemView);
    QAbstractScrollArea::focusInEvent(event);

    const QItemSelectionModel* model = selectionModel();
    bool currentIndexValid = currentIndex().isValid();

    if (model
        && !d->currentIndexSet
        && !currentIndexValid) {
        bool autoScroll = d->autoScroll;
        d->autoScroll = false;
        QModelIndex index = moveCursor(MoveNext, Qt::NoModifier); // first visible index
        if (index.isValid() && d->isIndexEnabled(index) && event->reason() != Qt::MouseFocusReason) {
            selectionModel()->setCurrentIndex(index, QItemSelectionModel::NoUpdate);
            currentIndexValid = true;
        }
        d->autoScroll = autoScroll;
    }

    if (model && currentIndexValid)
        setAttribute(Qt::WA_InputMethodEnabled, (currentIndex().flags() & Qt::ItemIsEditable));
    else if (!currentIndexValid)
        setAttribute(Qt::WA_InputMethodEnabled, false);

    d->viewport->update();
}